

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[17],_QString>,_char>,_QString>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[17],_QString>,_char>,_QString>
                *this)

{
  QString::~QString((QString *)0x1a6440);
  QStringBuilder<QStringBuilder<const_char_(&)[17],_QString>,_char>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<const_char_(&)[17],_QString>,_char> *)0x1a644a);
  return;
}

Assistant:

~QStringBuilder() = default;